

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::do_actual_learning<true>(ldf *data,single_learner *base,multi_ex *ec_seq_all)

{
  undefined8 *puVar1;
  pointer ppeVar2;
  action_score *__base;
  v_array<ACTION_SCORE::action_score> *pvVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  example **example_1;
  vw_exception *this;
  ulong uVar9;
  example **example;
  pointer ppeVar10;
  example *peVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  multi_ex ec_seq;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  ppeVar2 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar2) {
    data->ft_offset = ((*ppeVar2)->super_example_predict).ft_offset;
    process_labels(&ec_seq,data,ec_seq_all);
    lVar12 = (long)ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar12 != 0) {
      bVar8 = ec_seq_has_label_definition(&ec_seq);
      if (bVar8) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<(&local_1a8,"error: label definition encountered in data block");
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                   ,0x1b0,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      bVar8 = test_ldf_sequence(data,&ec_seq);
      uVar13 = lVar12 >> 3;
      if (data->rank == false) {
        fVar16 = 3.4028235e+38;
        uVar14 = 0;
        for (uVar9 = 0; (uVar13 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
          peVar11 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9];
          make_single_prediction(data,base,peVar11);
          fVar15 = peVar11->partial_prediction;
          if (fVar15 < fVar16) {
            uVar14 = uVar9 & 0xffffffff;
            fVar16 = fVar15;
          }
        }
      }
      else {
        v_array<ACTION_SCORE::action_score>::clear(&data->a_s);
        v_array<v_array<ACTION_SCORE::action_score>_>::clear(&data->stored_preds);
        for (uVar14 = 0; (uVar13 & 0xffffffff) != uVar14; uVar14 = uVar14 + 1) {
          peVar11 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14];
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (&data->stored_preds,
                     (v_array<ACTION_SCORE::action_score> *)&(peVar11->pred).scalars);
          make_single_prediction(data,base,peVar11);
          ___msg = (uint32_t)uVar14;
          v_array<ACTION_SCORE::action_score>::push_back(&data->a_s,(action_score *)&__msg);
        }
        __base = (data->a_s)._begin;
        qsort(__base,(long)(data->a_s)._end - (long)__base >> 3,8,ACTION_SCORE::score_comp);
        uVar14 = 0;
      }
      if (!bVar8) {
        if (data->is_wap == true) {
          do_actual_learning_wap(data,base,&ec_seq);
        }
        else {
          do_actual_learning_oaa(data,base,&ec_seq);
        }
      }
      if (data->rank == false) {
        for (uVar9 = 0; (uVar13 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
          if (uVar14 == uVar9) {
            peVar11 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14];
            fVar16 = (float)((peVar11->l).cs.costs._begin)->class_index;
          }
          else {
            peVar11 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9];
            fVar16 = 0.0;
          }
          (peVar11->pred).scalar = fVar16;
        }
      }
      else {
        v_array<ACTION_SCORE::action_score>::clear((data->stored_preds)._begin);
        for (lVar12 = 0; (uVar13 & 0xffffffff) << 3 != lVar12; lVar12 = lVar12 + 8) {
          pvVar3 = (data->stored_preds)._begin;
          lVar4 = *(long *)((long)ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar12);
          puVar1 = (undefined8 *)((long)&pvVar3->_begin + lVar12 * 4);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)&pvVar3->end_array + lVar12 * 4);
          uVar7 = puVar1[1];
          *(undefined8 *)(lVar4 + 0x6860) = *puVar1;
          *(undefined8 *)(lVar4 + 0x6868) = uVar7;
          *(undefined8 *)(lVar4 + 0x6850) = uVar5;
          *(undefined8 *)(lVar4 + 0x6858) = uVar6;
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)
                     &((*ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->pred).scalars,
                     (action_score *)((long)&((data->a_s)._begin)->action + lVar12));
        }
      }
      ppeVar2 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (data->is_probabilities == true) {
        fVar16 = 0.0;
        for (ppeVar10 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Vector_impl_data._M_start; ppeVar10 != ppeVar2;
            ppeVar10 = ppeVar10 + 1) {
          fVar15 = expf((*ppeVar10)->partial_prediction);
          fVar15 = 1.0 / (fVar15 + 1.0);
          ((*ppeVar10)->pred).scalar = fVar15;
          fVar16 = fVar16 + fVar15;
        }
        for (; ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start !=
               ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
            ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
          ((*ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
             super__Vector_impl_data._M_start)->pred).scalar =
               ((*ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->pred).scalar / fVar16;
        }
      }
    }
    std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
              (&ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>);
  }
  return;
}

Assistant:

void do_actual_learning(ldf& data, single_learner& base, multi_ex& ec_seq_all)
{
  if (ec_seq_all.size() == 0)
    return;  // nothing to do

  data.ft_offset = ec_seq_all[0]->ft_offset;

  // handle label definitions
  auto ec_seq = process_labels(data, ec_seq_all);
  if (ec_seq.size() == 0)
    return;  // nothing more to do

  // Ensure there are no more labels
  // (can be done in existing loops later but as a side effect learning
  //    will happen with bad example)
  if (ec_seq_has_label_definition(ec_seq))
  {
    THROW("error: label definition encountered in data block");
  }

  /////////////////////// add headers
  uint32_t K = (uint32_t)ec_seq.size();

  bool isTest = test_ldf_sequence(data, ec_seq);
  /////////////////////// do prediction
  uint32_t predicted_K = 0;
  if (data.rank)
  {
    data.a_s.clear();
    data.stored_preds.clear();
    for (uint32_t k = 0; k < K; k++)
    {
      example* ec = ec_seq[k];
      data.stored_preds.push_back(ec->pred.a_s);
      make_single_prediction(data, base, *ec);
      action_score s;
      s.score = ec->partial_prediction;
      s.action = k;
      data.a_s.push_back(s);
    }

    qsort((void*)data.a_s.begin(), data.a_s.size(), sizeof(action_score), score_comp);
  }
  else
  {
    float min_score = FLT_MAX;
    for (uint32_t k = 0; k < K; k++)
    {
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      if (ec->partial_prediction < min_score)
      {
        min_score = ec->partial_prediction;
        predicted_K = k;
      }
    }
  }

  /////////////////////// learn
  if (is_learn && !isTest)
  {
    if (data.is_wap)
      do_actual_learning_wap(data, base, ec_seq);
    else
      do_actual_learning_oaa(data, base, ec_seq);
  }

  if (data.rank)
  {
    data.stored_preds[0].clear();
    for (size_t k = 0; k < K; k++)
    {
      ec_seq[k]->pred.a_s = data.stored_preds[k];
      ec_seq[0]->pred.a_s.push_back(data.a_s[k]);
    }
  }
  else
  {
    // Mark the predicted subexample with its class_index, all other with 0
    for (size_t k = 0; k < K; k++)
    {
      if (k == predicted_K)
        ec_seq[k]->pred.multiclass = ec_seq[k]->l.cs.costs[0].class_index;
      else
        ec_seq[k]->pred.multiclass = 0;
    }
  }

  ////////////////////// compute probabilities
  if (data.is_probabilities)
  {
    float sum_prob = 0;
    for (const auto & example : ec_seq)
    {
      // probability(correct_class) = 1 / (1+exp(-score)), where score is higher for better classes,
      // but partial_prediction is lower for better classes (we are predicting the cost),
      // so we need to take score = -partial_prediction,
      // thus probability(correct_class) = 1 / (1+exp(-(-partial_prediction)))
      float prob = 1.f / (1.f + correctedExp(example->partial_prediction));
      example->pred.prob = prob;
      sum_prob += prob;
    }
    // make sure that the probabilities sum up (exactly) to one
    for (const auto& example : ec_seq)
    {
      example->pred.prob /= sum_prob;
    }
  }
}